

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O1

void __thiscall
btSimpleBroadphase::calculateOverlappingPairs(btSimpleBroadphase *this,btDispatcher *dispatcher)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  btBroadphasePair *pbVar4;
  btSimpleBroadphaseProxy *proxy0;
  btSimpleBroadphaseProxy *proxy1;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  btAlignedObjectArray<btBroadphasePair> *this_00;
  btBroadphasePair *pbVar9;
  long lVar10;
  btSimpleBroadphaseProxy *p1;
  ulong uVar11;
  btSimpleBroadphaseProxy *pbVar12;
  int iVar13;
  undefined8 *puVar14;
  btSimpleBroadphaseProxy *p0;
  long lVar15;
  long lVar16;
  btSimpleBroadphaseProxy *pbVar17;
  uint uVar18;
  btBroadphasePairSortPredicate local_3a;
  btBroadphasePairSortPredicate local_39;
  btDispatcher *local_38;
  undefined4 extraout_var_01;
  
  if (-1 < this->m_numHandles) {
    local_38 = dispatcher;
    if (this->m_LastHandleIndex < 0) {
      iVar7 = -1;
    }
    else {
      uVar8 = 0xffffffff;
      lVar15 = 0x40;
      uVar11 = 0;
      do {
        if (this->m_pHandles[uVar11].super_btBroadphaseProxy.m_clientObject != (void *)0x0) {
          if ((long)uVar11 < (long)this->m_LastHandleIndex) {
            pbVar12 = this->m_pHandles + uVar11;
            uVar8 = uVar11 & 0xffffffff;
            lVar16 = lVar15;
            do {
              if (*(long *)((long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
                           lVar16 + -0x1c) != 0) {
                pbVar17 = (btSimpleBroadphaseProxy *)
                          ((long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
                          lVar16 + -0x1c);
                bVar6 = aabbOverlap(pbVar12,pbVar17);
                if (bVar6) {
                  iVar7 = (*(this->m_pairCache->super_btOverlappingPairCallback).
                            _vptr_btOverlappingPairCallback[0xd])(this->m_pairCache,pbVar12,pbVar17)
                  ;
                  if (CONCAT44(extraout_var,iVar7) == 0) {
                    (*(this->m_pairCache->super_btOverlappingPairCallback).
                      _vptr_btOverlappingPairCallback[2])(this->m_pairCache,pbVar12,pbVar17);
                  }
                }
                else {
                  iVar7 = (*(this->m_pairCache->super_btOverlappingPairCallback).
                            _vptr_btOverlappingPairCallback[0xe])();
                  if (((char)iVar7 == '\0') &&
                     (iVar7 = (*(this->m_pairCache->super_btOverlappingPairCallback).
                                _vptr_btOverlappingPairCallback[0xd])
                                        (this->m_pairCache,pbVar12,pbVar17),
                     CONCAT44(extraout_var_00,iVar7) != 0)) {
                    (*(this->m_pairCache->super_btOverlappingPairCallback).
                      _vptr_btOverlappingPairCallback[3])
                              (this->m_pairCache,pbVar12,pbVar17,local_38);
                  }
                }
              }
              lVar16 = lVar16 + 0x40;
              uVar18 = (int)uVar8 + 1;
              uVar8 = (ulong)uVar18;
            } while ((int)uVar18 < this->m_LastHandleIndex);
            uVar8 = uVar11 & 0xffffffff;
          }
          else {
            uVar8 = uVar11 & 0xffffffff;
          }
        }
        iVar7 = (int)uVar8;
        lVar15 = lVar15 + 0x40;
        bVar6 = (long)uVar11 < (long)this->m_LastHandleIndex;
        uVar11 = uVar11 + 1;
      } while (bVar6);
    }
    this->m_LastHandleIndex = iVar7;
    if ((this->m_ownsPairCache == true) &&
       (iVar7 = (*(this->m_pairCache->super_btOverlappingPairCallback).
                  _vptr_btOverlappingPairCallback[0xe])(), (char)iVar7 != '\0')) {
      iVar7 = (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
                [7])();
      this_00 = (btAlignedObjectArray<btBroadphasePair> *)CONCAT44(extraout_var_01,iVar7);
      if (1 < this_00->m_size) {
        btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                  (this_00,&local_39,0,this_00->m_size + -1);
      }
      iVar7 = this_00->m_size;
      iVar2 = this->m_invalidPair;
      lVar16 = (long)iVar2;
      lVar15 = iVar7 - lVar16;
      iVar13 = (int)lVar15;
      if ((lVar16 < 1) && (iVar2 < 0)) {
        if (this_00->m_capacity < iVar13) {
          if (iVar7 == iVar2) {
            pbVar9 = (btBroadphasePair *)0x0;
          }
          else {
            pbVar9 = (btBroadphasePair *)btAlignedAllocInternal(lVar15 * 0x20,0x10);
          }
          iVar3 = this_00->m_size;
          if (0 < (long)iVar3) {
            lVar10 = 0;
            do {
              pbVar4 = this_00->m_data;
              puVar14 = (undefined8 *)((long)&pbVar4->m_pProxy0 + lVar10);
              uVar5 = puVar14[1];
              puVar1 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar10);
              *puVar1 = *puVar14;
              puVar1[1] = uVar5;
              *(undefined8 *)((long)&pbVar9->m_algorithm + lVar10) =
                   *(undefined8 *)((long)&pbVar4->m_algorithm + lVar10);
              *(undefined8 *)((long)&pbVar9->field_3 + lVar10) =
                   *(undefined8 *)((long)&pbVar4->field_3 + lVar10);
              lVar10 = lVar10 + 0x20;
            } while ((long)iVar3 * 0x20 != lVar10);
          }
          if (this_00->m_data != (btBroadphasePair *)0x0) {
            if (this_00->m_ownsMemory == true) {
              btAlignedFreeInternal(this_00->m_data);
            }
            this_00->m_data = (btBroadphasePair *)0x0;
          }
          this_00->m_ownsMemory = true;
          this_00->m_data = pbVar9;
          this_00->m_capacity = iVar13;
        }
        if (iVar2 < 0) {
          lVar10 = (long)iVar7 << 5;
          do {
            pbVar9 = this_00->m_data;
            puVar14 = (undefined8 *)((long)&pbVar9->m_algorithm + lVar10);
            *puVar14 = 0;
            puVar14[1] = 0;
            puVar14 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar10);
            *puVar14 = 0;
            puVar14[1] = 0;
            lVar10 = lVar10 + 0x20;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0);
        }
      }
      this_00->m_size = iVar13;
      this->m_invalidPair = 0;
      if (0 < iVar13) {
        lVar16 = 0;
        lVar10 = 0;
        pbVar12 = (btSimpleBroadphaseProxy *)0x0;
        pbVar17 = (btSimpleBroadphaseProxy *)0x0;
        do {
          pbVar9 = this_00->m_data;
          proxy0 = *(btSimpleBroadphaseProxy **)((long)&pbVar9->m_pProxy0 + lVar16);
          proxy1 = *(btSimpleBroadphaseProxy **)((long)&pbVar9->m_pProxy1 + lVar16);
          if ((pbVar12 == proxy1 && pbVar17 == proxy0) ||
             (bVar6 = aabbOverlap(proxy0,proxy1), !bVar6)) {
            puVar14 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar16);
            (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
              [8])(this->m_pairCache,puVar14,local_38);
            *puVar14 = 0;
            puVar14[1] = 0;
            this->m_invalidPair = this->m_invalidPair + 1;
            gOverlappingPairs = gOverlappingPairs + -1;
          }
          lVar10 = lVar10 + 1;
          lVar15 = (long)this_00->m_size;
          lVar16 = lVar16 + 0x20;
          pbVar12 = proxy1;
          pbVar17 = proxy0;
        } while (lVar10 < lVar15);
      }
      if (1 < (int)lVar15) {
        btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                  (this_00,&local_3a,0,(int)lVar15 + -1);
      }
      iVar7 = this_00->m_size;
      iVar2 = this->m_invalidPair;
      lVar15 = (long)iVar2;
      lVar16 = iVar7 - lVar15;
      iVar13 = (int)lVar16;
      if ((lVar15 < 1) && (iVar2 < 0)) {
        if (this_00->m_capacity < iVar13) {
          if (iVar7 == iVar2) {
            pbVar9 = (btBroadphasePair *)0x0;
          }
          else {
            pbVar9 = (btBroadphasePair *)btAlignedAllocInternal(lVar16 * 0x20,0x10);
          }
          iVar3 = this_00->m_size;
          if (0 < (long)iVar3) {
            lVar16 = 0;
            do {
              pbVar4 = this_00->m_data;
              puVar14 = (undefined8 *)((long)&pbVar4->m_pProxy0 + lVar16);
              uVar5 = puVar14[1];
              puVar1 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar16);
              *puVar1 = *puVar14;
              puVar1[1] = uVar5;
              *(undefined8 *)((long)&pbVar9->m_algorithm + lVar16) =
                   *(undefined8 *)((long)&pbVar4->m_algorithm + lVar16);
              *(undefined8 *)((long)&pbVar9->field_3 + lVar16) =
                   *(undefined8 *)((long)&pbVar4->field_3 + lVar16);
              lVar16 = lVar16 + 0x20;
            } while ((long)iVar3 * 0x20 != lVar16);
          }
          if (this_00->m_data != (btBroadphasePair *)0x0) {
            if (this_00->m_ownsMemory == true) {
              btAlignedFreeInternal(this_00->m_data);
            }
            this_00->m_data = (btBroadphasePair *)0x0;
          }
          this_00->m_ownsMemory = true;
          this_00->m_data = pbVar9;
          this_00->m_capacity = iVar13;
        }
        if (iVar2 < 0) {
          lVar16 = (long)iVar7 << 5;
          do {
            pbVar9 = this_00->m_data;
            puVar14 = (undefined8 *)((long)&pbVar9->m_algorithm + lVar16);
            *puVar14 = 0;
            puVar14[1] = 0;
            puVar14 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar16);
            *puVar14 = 0;
            puVar14[1] = 0;
            lVar16 = lVar16 + 0x20;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0);
        }
      }
      this_00->m_size = iVar13;
      this->m_invalidPair = 0;
    }
  }
  return;
}

Assistant:

void	btSimpleBroadphase::calculateOverlappingPairs(btDispatcher* dispatcher)
{
	//first check for new overlapping pairs
	int i,j;
	if (m_numHandles >= 0)
	{
		int new_largest_index = -1;
		for (i=0; i <= m_LastHandleIndex; i++)
		{
			btSimpleBroadphaseProxy* proxy0 = &m_pHandles[i];
			if(!proxy0->m_clientObject)
			{
				continue;
			}
			new_largest_index = i;
			for (j=i+1; j <= m_LastHandleIndex; j++)
			{
				btSimpleBroadphaseProxy* proxy1 = &m_pHandles[j];
				btAssert(proxy0 != proxy1);
				if(!proxy1->m_clientObject)
				{
					continue;
				}

				btSimpleBroadphaseProxy* p0 = getSimpleProxyFromProxy(proxy0);
				btSimpleBroadphaseProxy* p1 = getSimpleProxyFromProxy(proxy1);

				if (aabbOverlap(p0,p1))
				{
					if ( !m_pairCache->findPair(proxy0,proxy1))
					{
						m_pairCache->addOverlappingPair(proxy0,proxy1);
					}
				} else
				{
					if (!m_pairCache->hasDeferredRemoval())
					{
						if ( m_pairCache->findPair(proxy0,proxy1))
						{
							m_pairCache->removeOverlappingPair(proxy0,proxy1,dispatcher);
						}
					}
				}
			}
		}

		m_LastHandleIndex = new_largest_index;

		if (m_ownsPairCache && m_pairCache->hasDeferredRemoval())
		{

			btBroadphasePairArray&	overlappingPairArray = m_pairCache->getOverlappingPairArray();

			//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
			overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

			overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
			m_invalidPair = 0;


			btBroadphasePair previousPair;
			previousPair.m_pProxy0 = 0;
			previousPair.m_pProxy1 = 0;
			previousPair.m_algorithm = 0;


			for (i=0;i<overlappingPairArray.size();i++)
			{

				btBroadphasePair& pair = overlappingPairArray[i];

				bool isDuplicate = (pair == previousPair);

				previousPair = pair;

				bool needsRemoval = false;

				if (!isDuplicate)
				{
					bool hasOverlap = testAabbOverlap(pair.m_pProxy0,pair.m_pProxy1);

					if (hasOverlap)
					{
						needsRemoval = false;//callback->processOverlap(pair);
					} else
					{
						needsRemoval = true;
					}
				} else
				{
					//remove duplicate
					needsRemoval = true;
					//should have no algorithm
					btAssert(!pair.m_algorithm);
				}

				if (needsRemoval)
				{
					m_pairCache->cleanOverlappingPair(pair,dispatcher);

					//		m_overlappingPairArray.swap(i,m_overlappingPairArray.size()-1);
					//		m_overlappingPairArray.pop_back();
					pair.m_pProxy0 = 0;
					pair.m_pProxy1 = 0;
					m_invalidPair++;
					gOverlappingPairs--;
				} 

			}

			///if you don't like to skip the invalid pairs in the array, execute following code:
#define CLEAN_INVALID_PAIRS 1
#ifdef CLEAN_INVALID_PAIRS

			//perform a sort, to sort 'invalid' pairs to the end
			overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

			overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
			m_invalidPair = 0;
#endif//CLEAN_INVALID_PAIRS

		}
	}
}